

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

bool Fossilize::application_info_promote_robustness2(VkApplicationInfo *app_info)

{
  char *__s2;
  int iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  if (app_info == (VkApplicationInfo *)0x0) {
    return false;
  }
  __s2 = app_info->pEngineName;
  if (__s2 == (char *)0x0) {
    bVar3 = false;
  }
  else {
    lVar2 = 0;
    do {
      iVar1 = strcmp(*(char **)((long)application_info_promote_robustness2::promote_engine_names +
                               lVar2),__s2);
      bVar3 = iVar1 == 0;
      if (bVar3) {
        return bVar3;
      }
      bVar4 = lVar2 != 8;
      lVar2 = lVar2 + 8;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

static bool application_info_promote_robustness2(const VkApplicationInfo *app_info)
{
	if (!app_info || !app_info->pEngineName)
		return false;

	static const char *promote_engine_names[] =
	{
		"DXVK",
		"vkd3d",
	};

	for (const char *name : promote_engine_names)
		if (strcmp(name, app_info->pEngineName) == 0)
			return true;

	return false;
}